

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O1

void Gatherv(IceTCommunicator self,void *sendbuf,int sendcount,IceTEnum datatype,void *recvbuf,
            int *recvcounts,int *recvoffsets,int root)

{
  undefined *puVar1;
  void *pvVar2;
  
  if (datatype - 0x8000 < 6) {
    puVar1 = (&PTR_ompi_mpi_byte_00123d70)[datatype - 0x8000];
  }
  else {
    icetRaiseDiagnostic("MPI Communicator received bad data type.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,0x153);
    puVar1 = &ompi_mpi_byte;
  }
  pvVar2 = (void *)0x1;
  if (sendbuf != (void *)0xffffffffffffffff) {
    pvVar2 = sendbuf;
  }
  MPI_Gatherv(pvVar2,sendcount,puVar1,recvbuf,recvcounts,recvoffsets,puVar1,root,*self->data);
  return;
}

Assistant:

static void Gatherv(IceTCommunicator self,
                    const void *sendbuf,
                    int sendcount,
                    IceTEnum datatype,
                    void *recvbuf,
                    const int *recvcounts,
                    const int *recvoffsets,
                    int root)
{
    MPI_Datatype mpitype;
    CONVERT_DATATYPE(datatype, mpitype);

    if (sendbuf == ICET_IN_PLACE_COLLECT) {
        sendbuf = MPI_IN_PLACE;
    }

    MPI_Gatherv((void *)sendbuf, sendcount, mpitype,
                recvbuf, (int *)recvcounts, (int *)recvoffsets, mpitype,
                root, MPI_COMM);
}